

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

void __thiscall
google::protobuf::TextFormat::FastFieldValuePrinter::PrintUInt32
          (FastFieldValuePrinter *this,uint32_t val,BaseTextGenerator *generator)

{
  long lVar1;
  long *local_70;
  undefined8 local_68;
  long local_60 [2];
  long local_50;
  char *local_48;
  char local_40 [32];
  
  lVar1 = absl::lts_20240722::numbers_internal::FastIntToBuffer(val,local_40);
  local_50 = lVar1 - (long)local_40;
  local_70 = local_60;
  local_48 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,local_40,lVar1);
  (*generator->_vptr_BaseTextGenerator[5])(generator,local_70,local_68);
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  return;
}

Assistant:

void TextFormat::FastFieldValuePrinter::PrintUInt32(
    uint32_t val, BaseTextGenerator* generator) const {
  generator->PrintString(absl::StrCat(val));
}